

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

string * __thiscall
pbrt::TaggedPointer<pbrt::TransformMapping3D>::ToString_abi_cxx11_
          (TaggedPointer<pbrt::TransformMapping3D> *this)

{
  unsigned_short *args_1;
  TaggedPointer<pbrt::TransformMapping3D> *in_RSI;
  string *in_RDI;
  TaggedPointer<pbrt::TransformMapping3D> *args;
  string *fmt;
  
  args = in_RSI;
  fmt = in_RDI;
  args_1 = (unsigned_short *)ptr(in_RSI);
  Tag(in_RSI);
  StringPrintf<void_const*,unsigned_short>((char *)fmt,(void **)args,args_1);
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TaggedPointer ptr: 0x%p tag: %d ]", ptr(), Tag());
    }